

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O1

void __thiscall Js::SourceTextModuleRecord::GenerateRootFunction(SourceTextModuleRecord *this)

{
  Type *addr;
  Type *addr_00;
  ScriptContext *this_00;
  Var aValue;
  BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  SourceTextModuleRecord *pSVar6;
  JavascriptFunction *pJVar7;
  DebugContext *this_01;
  FunctionBody *func;
  JavascriptString *pJVar8;
  undefined4 extraout_var;
  JavascriptError *pJVar9;
  ulong uVar10;
  undefined1 auStack_98 [8];
  CompileScriptException se;
  AutoDynamicCodeReference dynamicFunctionReference;
  WCHAR *sourceUrl;
  
  if ((this->rootFunction).ptr == (JavascriptFunction *)0x0) {
    this_00 = (this->scriptContext).ptr;
    JavascriptLibrary::BeginDynamicFunctionReferences
              ((this_00->super_ScriptContextBase).javascriptLibrary);
    se.hasLineNumberInfo = false;
    se._81_7_ = 0;
    auStack_98._0_4_ = 0;
    auStack_98._4_4_ = 0;
    se.super_ScriptException.ichMin = 0;
    se.super_ScriptException.ichLim = 0;
    se.super_ScriptException.ei.wCode = 0;
    se.super_ScriptException.ei.wReserved = 0;
    se.super_ScriptException.ei._4_4_ = 0;
    se.super_ScriptException.ei.bstrSource = (BSTR)0x0;
    se.super_ScriptException.ei.bstrDescription = (BSTR)0x0;
    se.super_ScriptException.ei.bstrHelpFile = (BSTR)0x0;
    se.super_ScriptException.ei.dwHelpContext = 0;
    se.super_ScriptException.ei._36_4_ = 0;
    se.super_ScriptException.ei.pvReserved = (PVOID)0x0;
    se.super_ScriptException.ei.pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
    se.super_ScriptException.ei.scode = 0;
    se.super_ScriptException.ei._60_4_ = 0;
    se.line._0_1_ = 0;
    if (this->wasDeclarationInitialized == false) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                  ,0x3b0,"(this->WasDeclarationInitialized())",
                                  "this->WasDeclarationInitialized()");
      if (!bVar3) goto LAB_00b15178;
      *puVar5 = 0;
    }
    pSVar6 = JavascriptLibrary::GetModuleRecord
                       ((this_00->super_ScriptContextBase).javascriptLibrary,
                        ((((this->pSourceInfo).ptr)->m_srcInfo).ptr)->moduleID);
    if (pSVar6 != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                  ,0x3b1,
                                  "(this == scriptContext->GetLibrary()->GetModuleRecord(this->pSourceInfo->GetSrcInfo()->moduleID))"
                                  ,
                                  "this == scriptContext->GetLibrary()->GetModuleRecord(this->pSourceInfo->GetSrcInfo()->moduleID)"
                                 );
      if (!bVar3) {
LAB_00b15178:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pJVar7 = ScriptContext::GenerateRootFunction
                       (this_00,(this->parseTree).ptr,this->sourceIndex,this->parser,
                        ((this->pSourceInfo).ptr)->parseFlags,(CompileScriptException *)auStack_98,
                        L"Module code");
    addr = &this->rootFunction;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pJVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    if (this->parser != (Parser *)0x0) {
      Parser::ReleaseTemporaryGuestArena(this->parser);
    }
    if (addr->ptr == (JavascriptFunction *)0x0) {
      aValue = (this->normalizedSpecifier).ptr;
      if (aValue == (Var)0x0) {
        sourceUrl = L"module";
      }
      else {
        pJVar8 = VarTo<Js::JavascriptString>(aValue);
        iVar4 = (*(pJVar8->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar8);
        sourceUrl = (WCHAR *)CONCAT44(extraout_var,iVar4);
      }
      pJVar9 = JavascriptError::CreateFromCompileScriptException
                         (this_00,(CompileScriptException *)auStack_98,sourceUrl);
      addr_00 = &this->errorObject;
      Memory::Recycler::WBSetBit((char *)addr_00);
      addr_00->ptr = pJVar9;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
      Output::TraceWithFlush(ModulePhase,L"\t>NotifyParentAsNeeded rootFunction == nullptr\n");
      NotifyParentsAsNeeded(this);
    }
    else {
      this_01 = ScriptContext::GetDebugContext(this_00);
      func = JavascriptFunction::GetFunctionBody(addr->ptr);
      DebugContext::RegisterFunction(this_01,&func->super_ParseableFunctionInfo,(LPCWSTR)0x0);
    }
    pBVar1 = (this->childrenModuleSet).ptr;
    if ((pBVar1 != (BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)0x0) && (pBVar1->bucketCount != 0)) {
      uVar10 = 0;
      do {
        for (iVar4 = pBVar1->buckets[uVar10]; iVar4 != -1;
            iVar4 = pBVar1->entries[iVar4].
                    super_DefaultHashedEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*>.
                    super_ValueEntry<Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>_>
                    .super_KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>.
                    next) {
          (**(code **)(*(long *)&((pBVar1->entries[iVar4].
                                   super_DefaultHashedEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                   .
                                   super_KeyValueEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*>
                                   .
                                   super_ValueEntry<Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>_>
                                   .
                                   super_KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>
                                  .value)->super_ModuleRecordBase).super_FinalizableObject + 0x58))
                    ();
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < pBVar1->bucketCount);
    }
    CompileScriptException::~CompileScriptException((CompileScriptException *)auStack_98);
    JavascriptLibrary::EndDynamicFunctionReferences
              ((this_00->super_ScriptContextBase).javascriptLibrary);
  }
  return;
}

Assistant:

void SourceTextModuleRecord::GenerateRootFunction()
    {
        // On cyclic dependency, we may end up generating the root function twice
        // so make sure we don't
        if (this->rootFunction != nullptr)
        {
            return;
        }

        ScriptContext* scriptContext = GetScriptContext();
        Js::AutoDynamicCodeReference dynamicFunctionReference(scriptContext);
        CompileScriptException se;

        Assert(this->WasDeclarationInitialized());
        Assert(this == scriptContext->GetLibrary()->GetModuleRecord(this->pSourceInfo->GetSrcInfo()->moduleID));

        this->rootFunction = scriptContext->GenerateRootFunction(parseTree, sourceIndex, this->parser, this->pSourceInfo->GetParseFlags(), &se, Constants::ModuleCode);

        // Parser uses a temporary guest arena to keep regex patterns alive. We need to release this arena only after we have no further use
        // for the regex pattern objects.
        this->ReleaseParserResources();

        if (rootFunction == nullptr)
        {
            const WCHAR * sourceUrl = this->GetSpecifierSz();

            this->errorObject = JavascriptError::CreateFromCompileScriptException(scriptContext, &se, sourceUrl);
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyParentAsNeeded rootFunction == nullptr\n"));
            NotifyParentsAsNeeded();
        }
#ifdef ENABLE_SCRIPT_DEBUGGING
        else
        {
            scriptContext->GetDebugContext()->RegisterFunction(this->rootFunction->GetFunctionBody(), nullptr);
        }
#endif
        if (childrenModuleSet != nullptr)
        {
            childrenModuleSet->EachValue([=](SourceTextModuleRecord* childModuleRecord)
            {
                childModuleRecord->GenerateRootFunction();
            });
        }
    }